

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

void __thiscall amrex::Amr::setRecordGridInfo(Amr *this,string *filename)

{
  string local_30;
  
  this->record_grid_info = 1;
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    std::ofstream::open((char *)&this->gridlog,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
    if (*(int *)(&this->field_0x2f0 + *(long *)(*(long *)&this->gridlog + -0x18)) != 0) {
      FileOpenFailed(filename);
    }
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Amr::setRecordGridInfo","");
  ParallelDescriptor::Barrier(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
Amr::setRecordGridInfo (const std::string& filename)
{
    record_grid_info = true;
    if (ParallelDescriptor::IOProcessor())
    {
        gridlog.open(filename.c_str(),std::ios::out|std::ios::app);
        if (!gridlog.good())
            amrex::FileOpenFailed(filename);
    }
    ParallelDescriptor::Barrier("Amr::setRecordGridInfo");
}